

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddExtSymmCheck(DdManager *table,int x,int y)

{
  anon_union_16_2_50f58667_for_type *paVar1;
  DdHalfWord y_00;
  DdSubtable *pDVar2;
  DdManager *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  DdHalfWord DVar10;
  DdNode *pDVar11;
  ulong uVar12;
  DdNode **ppDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  DdNode *pDVar17;
  bool bVar18;
  
  y_00 = table->invperm[y];
  iVar6 = cuddTestInteract(table,table->invperm[x],y_00);
  if (iVar6 == 0) {
LAB_006580ee:
    uVar7 = 0;
  }
  else {
    pDVar2 = table->subtables;
    iVar6 = (int)(((double)table->symmviolation / 100.0) * (double)pDVar2[x].keys + 0.5);
    uVar12 = 0;
    uVar9 = (ulong)pDVar2[x].slots;
    if ((int)pDVar2[x].slots < 1) {
      uVar9 = uVar12;
    }
    iVar8 = 0;
    for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      ppDVar13 = pDVar2[x].nodelist + uVar12;
      while (pDVar3 = (DdManager *)*ppDVar13, pDVar3 != table) {
        pDVar14 = (pDVar3->sentinel).type.kids.T;
        pDVar4 = (pDVar3->sentinel).type.kids.E;
        pDVar15 = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
        bVar18 = true;
        if ((pDVar14 == table->one) && (table->one == pDVar15)) {
          bVar18 = (pDVar3->sentinel).ref != 1;
        }
        if (pDVar14->index == y_00) {
          iVar8 = iVar8 + 1;
          paVar1 = &pDVar14->type;
          pDVar14 = (pDVar14->type).kids.E;
          DVar10 = pDVar15->index;
          pDVar17 = (paVar1->kids).T;
        }
        else {
          DVar10 = pDVar15->index;
          pDVar17 = pDVar14;
          if ((bool)(DVar10 != y_00 & bVar18)) {
            if (iVar6 == 0) goto LAB_006580ee;
            iVar6 = iVar6 + -1;
          }
        }
        pDVar16 = pDVar15;
        if (DVar10 == y_00) {
          iVar8 = iVar8 + 1;
          paVar1 = &pDVar15->type;
          pDVar15 = (pDVar15->type).kids.T;
          pDVar16 = (paVar1->kids).E;
        }
        pDVar11 = (DdNode *)((ulong)pDVar15 ^ 1);
        pDVar5 = (DdNode *)((ulong)pDVar16 ^ 1);
        if (((ulong)pDVar4 & 1) == 0) {
          pDVar11 = pDVar15;
          pDVar5 = pDVar16;
        }
        if (((bVar18) && (pDVar11 != pDVar14)) && (pDVar17 != pDVar5)) {
          if (iVar6 == 0) goto LAB_006580ee;
          iVar6 = iVar6 + -1;
        }
        ppDVar13 = &(pDVar3->sentinel).next;
      }
    }
    uVar12 = 0;
    uVar9 = (ulong)pDVar2[y].slots;
    if ((int)pDVar2[y].slots < 1) {
      uVar9 = uVar12;
    }
    iVar6 = -1;
    for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      ppDVar13 = pDVar2[y].nodelist + uVar12;
      while (pDVar3 = (DdManager *)*ppDVar13, pDVar3 != table) {
        iVar6 = iVar6 + (pDVar3->sentinel).ref;
        ppDVar13 = &(pDVar3->sentinel).next;
      }
    }
    uVar7 = (uint)(iVar6 - (int)(((double)table->arcviolation / 100.0) * (double)pDVar2[y].keys +
                                0.5) <= iVar8);
  }
  return uVar7;
}

Assistant:

static int
ddExtSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    DdNode *one;
    unsigned comple;    /* f0 is complemented */
    int notproj;        /* f is not a projection function */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int counter;        /* number of nodes of layer x that are allowed */
                        /* to violate extended symmetry conditions */
    int arccounter;     /* number of arcs into layer y that are allowed */
                        /* to come from layers other than x */
    int i;
    int xindex;
    int yindex;
    int res;
    int slots;
    DdNodePtr *list;
    DdNode *sentinel = &(table->sentinel);

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    /* If the two variables do not interact, we do not want to merge them. */
    if (!cuddTestInteract(table,xindex,yindex))
        return(0);

#ifdef DD_DEBUG
    /* Checks that x and y do not contain just the projection functions.
    ** With the test on interaction, these test become redundant,
    ** because an isolated projection function does not interact with
    ** any other variable.
    */
    if (table->subtables[x].keys == 1) {
        assert(table->vars[xindex]->ref != 1);
    }
    if (table->subtables[y].keys == 1) {
        assert(table->vars[yindex]->ref != 1);
    }
#endif

#ifdef DD_STATS
    extsymmcalls++;
#endif

    arccount = 0;
    counter = (int) (table->subtables[x].keys *
              (table->symmviolation/100.0) + 0.5);
    one = DD_ONE(table);

    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            notproj = f1 != one || f0 != one || f->ref != (DdHalfWord) 1;
            if (f1->index == (unsigned) yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (notproj) {
                        if (counter == 0)
                            return(0);
                        counter--; /* f bypasses layer y */
                    }
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            /* Unless we are looking at a projection function
            ** without external references except the one from the
            ** table, we insist that f01 == f10 or f11 == f00
            */
            if (notproj) {
                if (f01 != f10 && f11 != f00) {
                    if (counter == 0)
                        return(0);
                    counter--;
                }
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

    arccounter = (int) (table->subtables[y].keys *
                 (table->arcviolation/100.0) + 0.5);
    res = arccount >= TotalRefCount - arccounter;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (res) {
        (void) fprintf(table->out,
                       "Found extended symmetry! x = %d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

#ifdef DD_STATS
    if (res)
        extsymm++;
#endif
    return(res);

}